

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_pipeline_layout_handle
          (Impl *this,VkPipelineLayout layout,VkPipelineLayout *out_layout)

{
  bool bVar1;
  const_iterator cVar2;
  long *in_FS_OFFSET;
  VkPipelineLayout layout_local;
  
  if (layout == (VkPipelineLayout)0x0) {
    *out_layout = (VkPipelineLayout)0x0;
  }
  else {
    layout_local = layout;
    cVar2 = std::
            _Hashtable<VkPipelineLayout_T_*,_std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipelineLayout_T_*>,_std::hash<VkPipelineLayout_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->pipeline_layout_to_hash)._M_h,&layout_local);
    if (cVar2.super__Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) {
      if (*(int *)(*in_FS_OFFSET + -0x18) < 2) {
        bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Cannot find pipeline layout in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                          );
        if (bVar1) {
          return false;
        }
        fwrite("Fossilize WARN: Cannot find pipeline layout in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               ,0x83,1,_stderr);
      }
      return false;
    }
    *out_layout = *(VkPipelineLayout *)
                   ((long)cVar2.
                          super__Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>
                          ._M_cur + 0x10);
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_pipeline_layout_handle(VkPipelineLayout layout, VkPipelineLayout *out_layout) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// This is allowed in VK_EXT_graphics_pipeline_library.
		*out_layout = VK_NULL_HANDLE;
		return true;
	}

	auto itr = pipeline_layout_to_hash.find(layout);
	if (itr == end(pipeline_layout_to_hash))
	{
		LOGW_LEVEL("Cannot find pipeline layout in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_layout = api_object_cast<VkPipelineLayout>(uint64_t(itr->second));
		return true;
	}
}